

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O2

void __thiscall
Printer_printModelWithStandardUnitsAdded_Test::Printer_printModelWithStandardUnitsAdded_Test
          (Printer_printModelWithStandardUnitsAdded_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00119060;
  return;
}

Assistant:

TEST(Printer, printModelWithStandardUnitsAdded)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"my_model\"/>\n";

    libcellml::ModelPtr model = libcellml::Model::create("my_model");
    libcellml::UnitsPtr u = libcellml::Units::create("second");

    model->addUnits(u);

    EXPECT_EQ(size_t(1), model->unitsCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    EXPECT_EQ(e, printer->printModel(model));
}